

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O0

void * parseNumber(SymbolContext<char> *ctx)

{
  JSONValue *this;
  size_t in_RCX;
  void *__buf;
  double d;
  SymbolContext<char> local_30;
  SymbolContext<char> *local_10;
  SymbolContext<char> *ctx_local;
  
  local_10 = ctx;
  this = (JSONValue *)operator_new(0x10);
  Centaurus::SymbolContext<char>::read_abi_cxx11_(&local_30,(int)local_10,__buf,in_RCX);
  d = std::__cxx11::stod((string *)&local_30,(size_t *)0x0);
  JSONValue::JSONValue(this,d);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

void *parseNumber(const SymbolContext<char>& ctx)
{
    return new JSONValue(std::stod(ctx.read()));
}